

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<-18>,_boost::random::detail::M3<-14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<-24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<-1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_2933843930U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<_18>,_boost::random::detail::M3<_14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<_24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<_1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>,_2933843930U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [19];
  uint *local_70;
  uint local_68 [19];
  uint local_1c [3];
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)local_68 + lVar2) = 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x4c);
  local_70 = local_68;
  boost::random::
  well_engine<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,boost::random::detail::M3<-18>,boost::random::detail::M3<-14>,boost::random::detail::M0,boost::random::detail::M3<18>,boost::random::detail::M3<-24>,boost::random::detail::M3<5>,boost::random::detail::M3<-1>,boost::random::detail::M0,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,boost::random::detail::M3<_18>,boost::random::detail::M3<_14>,boost::random::detail::M0,boost::random::detail::M3<18>,boost::random::detail::M3<_24>,boost::random::detail::M3<5>,boost::random::detail::M3<_1>,boost::random::detail::M0,boost::random::detail::no_tempering>
              *)this,&local_70,local_1c);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = boost::random::
            well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_boost::random::detail::M3<-18>,_boost::random::detail::M3<-14>,_boost::random::detail::M0,_boost::random::detail::M3<18>,_boost::random::detail::M3<-24>,_boost::random::detail::M3<5>,_boost::random::detail::M3<-1>,_boost::random::detail::M0,_boost::random::detail::no_tempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }